

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O3

void __thiscall
unodb::test::
tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::tree_verifier(tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                *this,bool parallel_test_)

{
  _Rb_tree_header *p_Var1;
  undefined1 auVar2 [32];
  inode_type_counter_array local_48;
  
  p_Var1 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  this->unused_key = auVar2._0_8_;
  (this->test_db).db_.root = (node_ptr)auVar2._8_8_;
  (this->test_db).db_.current_memory_use = auVar2._16_8_;
  (this->test_db).db_.node_counts._M_elems[0] = auVar2._24_8_;
  *(undefined1 (*) [32])((this->test_db).db_.node_counts._M_elems + 1) = auVar2;
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])(this->test_db).db_.growing_inode_counts._M_elems = auVar2;
  *(undefined1 (*) [32])(this->test_db).db_.shrinking_inode_counts._M_elems = auVar2;
  *(undefined1 (*) [32])&(this->test_db).db_.key_prefix_splits = auVar2;
  *(undefined1 (*) [32])((long)&(this->test_db).mutex.super___mutex_base._M_mutex + 8) = auVar2;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->parallel_test = parallel_test_;
  (this->key_views).
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT416(0) << 0x40,0);
  (this->key_views).
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT416(0) << 0x40,8);
  (this->key_views).
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  assert_empty(this);
  local_48._M_elems[0] = 0;
  local_48._M_elems[1] = 0;
  local_48._M_elems[2] = 0;
  local_48._M_elems[3] = 0;
  assert_growing_inodes(this,&local_48);
  local_48._M_elems[0] = 0;
  local_48._M_elems[1] = 0;
  local_48._M_elems[2] = 0;
  local_48._M_elems[3] = 0;
  assert_shrinking_inodes(this,&local_48);
  assert_key_prefix_splits(this,0);
  return;
}

Assistant:

explicit tree_verifier(bool parallel_test_ = false)
      : parallel_test{parallel_test_} {
    assert_empty();
#ifdef UNODB_DETAIL_WITH_STATS
    assert_growing_inodes({0, 0, 0, 0});
    assert_shrinking_inodes({0, 0, 0, 0});
    assert_key_prefix_splits(0);
#endif  // UNODB_DETAIL_WITH_STATS
  }